

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O3

int __thiscall
rw::Material::clone(Material *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Texture *pTVar1;
  float32 fVar2;
  Material *dst;
  undefined4 uVar3;
  undefined4 uVar4;
  int __flags_00;
  Material *__fn_00;
  
  uVar4 = (undefined4)((ulong)___flags >> 0x20);
  uVar3 = (undefined4)___flags;
  __fn_00 = this;
  dst = create();
  if (dst == (Material *)0x0) {
    clone((__fn *)__fn_00,__fn,__flags_00,(void *)CONCAT44(uVar4,uVar3));
  }
  else {
    dst->color = this->color;
    (dst->surfaceProps).diffuse = (this->surfaceProps).diffuse;
    fVar2 = (this->surfaceProps).specular;
    (dst->surfaceProps).ambient = (this->surfaceProps).ambient;
    (dst->surfaceProps).specular = fVar2;
    pTVar1 = this->texture;
    if (pTVar1 != (Texture *)0x0) {
      if (dst->texture != (Texture *)0x0) {
        Texture::destroy(dst->texture);
      }
      pTVar1->refCount = pTVar1->refCount + 1;
      dst->texture = pTVar1;
    }
    dst->pipeline = this->pipeline;
    PluginList::copy((PluginList *)&s_plglist,(EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)this);
  }
  return (int)dst;
}

Assistant:

Material*
Material::clone(void)
{
	Material *mat = Material::create();
	if(mat == nil){
		RWERROR((ERR_ALLOC, s_plglist.size));
		return nil;
	}
	mat->color = this->color;
	mat->surfaceProps = this->surfaceProps;
	if(this->texture)
		mat->setTexture(this->texture);
	mat->pipeline = this->pipeline;
	s_plglist.copy(mat, this);
	return mat;
}